

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O3

bool __thiscall
Rml::CallbackTextureInterface::GenerateTexture
          (CallbackTextureInterface *this,Span<const_unsigned_char> source,Vector2i new_dimensions)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  if (*this->texture_handle == 0) {
    iVar3 = (*this->render_interface->_vptr_RenderInterface[6])
                      (this->render_interface,source.m_data,source.m_size);
    *this->texture_handle = CONCAT44(extraout_var,iVar3);
    if (CONCAT44(extraout_var,iVar3) != 0) {
      *this->dimensions = new_dimensions;
      return *this->texture_handle != 0;
    }
  }
  else {
    bVar2 = Assert("Texture already set",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/CallbackTexture.cpp"
                   ,0x39);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return false;
}

Assistant:

bool CallbackTextureInterface::GenerateTexture(Span<const byte> source, Vector2i new_dimensions) const
{
	if (texture_handle)
	{
		RMLUI_ERRORMSG("Texture already set");
		return false;
	}
	texture_handle = render_interface.GenerateTexture(source, new_dimensions);
	if (texture_handle)
		dimensions = new_dimensions;
	return texture_handle != TextureHandle{};
}